

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O1

oonf_layer2_data *
oonf_layer2_neigh_get_data(oonf_layer2_neigh *l2neigh,oonf_layer2_neighbor_index idx)

{
  oonf_layer2_net *poVar1;
  oonf_layer2_data *poVar2;
  
  if ((l2neigh->data[idx]._origin != (oonf_layer2_origin *)0x0) &&
     (l2neigh->data[idx]._meta != (oonf_layer2_metadata *)0x0)) {
    return l2neigh->data + idx;
  }
  poVar1 = l2neigh->network;
  if (poVar1->neighdata[idx]._origin != (oonf_layer2_origin *)0x0) {
    poVar2 = poVar1->neighdata + idx;
    if (poVar1->neighdata[idx]._meta == (oonf_layer2_metadata *)0x0) {
      poVar2 = (oonf_layer2_data *)0x0;
    }
    return poVar2;
  }
  return (oonf_layer2_data *)0x0;
}

Assistant:

struct oonf_layer2_data *
oonf_layer2_neigh_get_data(struct oonf_layer2_neigh *l2neigh, enum oonf_layer2_neighbor_index idx) {
  struct oonf_layer2_data *data;

  data = &l2neigh->data[idx];
  if (oonf_layer2_data_has_value(data)) {
    return data;
  }

  /* look for network specific default */
  data = &l2neigh->network->neighdata[idx];
  if (oonf_layer2_data_has_value(data)) {
    return data;
  }
  return NULL;
}